

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c140.c
# Opt level: O0

void device_reset_c140(void *chip)

{
  int local_1c;
  int i;
  c140_state *info;
  void *chip_local;
  
  memset((void *)((long)chip + 0x28),0,0x200);
  for (local_1c = 0; local_1c < 0x18; local_1c = local_1c + 1) {
    init_voice((C140_VOICE *)((long)chip + (long)local_1c * 0x24 + 0x428));
  }
  return;
}

Assistant:

static void device_reset_c140(void *chip)
{
	c140_state *info = (c140_state *)chip;
	int i;
	
	memset(info->REG, 0, sizeof(info->REG));
	
	for(i = 0; i < MAX_VOICE; i ++)
	{
		init_voice(&info->voi[i]);
	}
	
	return;
}